

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshotExtractor.cpp
# Opt level: O0

void __thiscall TTD::SnapshotExtractor::MarkVisitType(SnapshotExtractor *this,Type *type)

{
  bool bVar1;
  DynamicTypeHandler *handler_00;
  RecyclableObject *var;
  RecyclableObject *proto;
  DynamicTypeHandler *handler;
  Type *type_local;
  SnapshotExtractor *this_local;
  
  bVar1 = MarkTable::MarkAndTestAddr<(TTD::MarkTableTag)2>(&this->m_marks,type);
  if (bVar1) {
    bVar1 = Js::DynamicType::Is(type);
    if (bVar1) {
      handler_00 = Js::DynamicType::GetTypeHandler((DynamicType *)type);
      MarkVisitHandler(this,handler_00);
    }
    var = Js::Type::GetPrototype(type);
    if (var != (RecyclableObject *)0x0) {
      MarkVisitVar(this,var);
    }
  }
  return;
}

Assistant:

void SnapshotExtractor::MarkVisitType(Js::Type* type)
    {
        //Must ensure this is de-serialized before you call this

        if(this->m_marks.MarkAndTestAddr<MarkTableTag::TypeTag>(type))
        {
            if(Js::DynamicType::Is(type))
            {
                Js::DynamicTypeHandler* handler = (static_cast<Js::DynamicType*>(type))->GetTypeHandler();

                this->MarkVisitHandler(handler);
            }

            Js::RecyclableObject* proto = type->GetPrototype();
            if(proto != nullptr)
            {
                this->MarkVisitVar(proto);
            }
        }
    }